

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O1

textblock * object_info_out(object *obj,wchar_t mode)

{
  bitflag *flags_00;
  random_value *prVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  monster_race *pmVar5;
  curse_data *pcVar6;
  ego_item *peVar7;
  _Bool *p_Var8;
  random_value v;
  random_value v_00;
  random_value v_01;
  player *ppVar9;
  bool bVar10;
  _Bool _Var11;
  _Bool _Var12;
  _Bool _Var13;
  _Bool _Var14;
  wchar_t wVar15;
  int iVar16;
  int iVar17;
  wchar_t wVar18;
  int iVar19;
  textblock *tb;
  artifact_set *paVar20;
  set_item *psVar21;
  obj_property *poVar22;
  char **ppcVar23;
  effect *effect;
  effect *peVar24;
  wchar_t *pwVar25;
  textblock *tba;
  undefined7 extraout_var;
  object *poVar26;
  object *poVar27;
  long lVar28;
  player_state_conflict *ppVar29;
  size_t vul;
  undefined8 *puVar30;
  wchar_t i;
  int iVar31;
  wchar_t wVar32;
  ulong uVar33;
  ulong uVar34;
  uint8_t attr;
  undefined2 uVar35;
  uint uVar36;
  char *pcVar37;
  long lVar38;
  _Bool printed;
  int iVar39;
  ulong uVar40;
  wchar_t count_1;
  wchar_t count;
  char *pcVar41;
  ulong uVar42;
  char cVar43;
  wchar_t i_2;
  uint uVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  object *obj1;
  bitflag flags [6];
  wchar_t deciturns [5];
  element_info el_info [28];
  char name [80];
  char loot_spot [80];
  bitflag local_5c6 [6];
  int local_5c0;
  uint local_5bc;
  wchar_t local_5b8;
  int local_5b4;
  object *local_5b0;
  int local_5a4;
  int local_5a0;
  wchar_t local_59c;
  int local_598 [8];
  undefined2 uStack_578;
  byte abStack_576 [110];
  player_state_conflict local_508;
  player_state_conflict local_3c8 [2];
  
  tb = textblock_new();
  if (obj->known == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                  ,0x7c1,"textblock *object_info_out(const struct object *, int)");
  }
  if (obj->kind != obj->known->kind) {
    pcVar37 = "\n\nYou do not know what this is.\n";
    goto LAB_00199ba4;
  }
  if ((mode & 4U) == 0) {
    object_flags_known(obj,local_5c6);
    if ((mode & 1U) != 0) {
      flag_diff(local_5c6,obj->kind->base->flags,6);
    }
  }
  else {
    object_flags(obj,local_5c6);
  }
  poVar27 = player->obj_k;
  poVar26 = obj->known;
  lVar28 = 0;
  do {
    if (((mode & 0x10U) != 0) ||
       (uVar35 = 100, *(short *)((long)&poVar27->el_info[0].res_level + lVar28) != 0)) {
      uVar35 = *(undefined2 *)((long)&poVar26->el_info[0].res_level + lVar28);
    }
    *(undefined2 *)((long)&uStack_578 + lVar28) = uVar35;
    bVar2 = (&poVar26->el_info[0].flags)[lVar28];
    abStack_576[lVar28] = bVar2;
    bVar3 = (&obj->el_info[0].flags)[lVar28];
    if ((bVar3 & 2) != 0) {
      abStack_576[lVar28] = bVar2 & (bVar3 & 1) - 3;
    }
    if ((mode & 1U) != 0) {
      abStack_576[lVar28] = abStack_576[lVar28] & 0xfe;
    }
    lVar28 = lVar28 + 4;
  } while (lVar28 != 0x70);
  if ((mode & 2U) == 0) goto LAB_00199ea2;
  if (((mode & 1U) != 0) && (_Var11 = obj_can_wear(obj), !_Var11))
  goto switchD_00199e47_caseD_ffffffff;
  if ((obj->origin != 0x18) || (uVar44 = 1, obj->mimicking_m_idx == 0)) {
    uVar44 = (uint)obj->origin;
  }
  pcVar37 = level_name(world->levels + obj->origin_place);
  _Var11 = false;
  strnfmt((char *)local_3c8,0x50,"in %s",pcVar37);
  pmVar5 = obj->origin_race;
  if (pmVar5 == (monster_race *)0x0) {
    pcVar37 = "monster lost to history";
    _Var12 = false;
  }
  else {
    pcVar37 = pmVar5->name;
    _Var11 = flag_has_dbg(pmVar5->flags,0xc,1,"obj->origin_race->flags","RF_UNIQUE");
    _Var12 = flag_has_dbg(obj->origin_race->flags,0xc,6,"obj->origin_race->flags","RF_NAME_COMMA");
  }
  _Var13 = is_a_vowel((int)*pcVar37);
  pcVar41 = "a ";
  if (_Var13) {
    pcVar41 = "an ";
  }
  if ((_Var11 == false) ||
     (_Var11 = flag_has_dbg(obj->origin_race->flags,0xc,2,"obj->origin_race->flags",
                            "RF_PLAYER_GHOST"), _Var11)) {
    my_strcpy((char *)&local_508,pcVar41,0x50);
    my_strcat((char *)&local_508,pcVar37,0x50);
  }
  else {
    my_strcpy((char *)&local_508,pcVar37,0x50);
  }
  if (_Var12 != false) {
    my_strcat((char *)&local_508,",",0x50);
  }
  uVar33 = (ulong)(uVar44 << 4);
  switch(*(undefined4 *)((long)&origins[0].args + uVar33)) {
  case 0:
    ppVar29 = *(player_state_conflict **)((long)&origins[0].desc + uVar33);
    pcVar37 = "%s";
    goto LAB_00199e62;
  case 1:
    pcVar37 = *(char **)((long)&origins[0].desc + uVar33);
    ppVar29 = local_3c8;
LAB_00199e62:
    textblock_append(tb,pcVar37,ppVar29);
    break;
  case 2:
    textblock_append(tb,*(char **)((long)&origins[0].desc + uVar33),&local_508);
    break;
  case 0xffffffff:
    goto switchD_00199e47_caseD_ffffffff;
  }
  textblock_append(tb,"\n\n");
switchD_00199e47_caseD_ffffffff:
LAB_00199ea2:
  if ((mode & 1U) == 0) {
    if (((obj->artifact == (artifact *)0x0) || (obj->known->artifact == (artifact *)0x0)) ||
       (pcVar37 = obj->artifact->text, pcVar37 == (char *)0x0)) {
      _Var11 = object_flavor_is_aware(obj);
      if ((mode & 4U) != 0 || _Var11) {
        if (((mode & 4U) == 0) && (obj->kind->text != (char *)0x0)) {
          textblock_append(tb,"%s");
          bVar47 = true;
        }
        else {
          bVar47 = false;
        }
        if ((((mode & 4U) != 0) || (obj->known->ego != (ego_item *)0x0)) &&
           (obj->ego->text != (char *)0x0)) {
          if (bVar47) {
            textblock_append(tb,"  ");
          }
          pcVar37 = obj->ego->text;
          goto LAB_00199f48;
        }
        if (bVar47) {
          textblock_append(tb,"\n\n");
        }
      }
    }
    else {
LAB_00199f48:
      textblock_append(tb,"%s\n\n",pcVar37);
    }
  }
  _Var11 = object_fully_known(obj);
  if (((_Var11) || ((obj->known->notice & 2) == 0)) || (_Var11 = tval_is_useable(obj), _Var11)) {
    bVar47 = false;
  }
  else {
    textblock_append(tb,"You do not know the full extent of this item\'s powers.\n");
    bVar47 = true;
  }
  _Var11 = object_is_known_artifact(obj);
  if ((_Var11) && (paVar20 = get_artifact_set(obj->artifact), paVar20 != (artifact_set *)0x0)) {
    psVar21 = (set_item *)&paVar20->set_item;
    do {
      psVar21 = psVar21->next;
      if (psVar21 == (set_item *)0x0) goto LAB_00199fe8;
    } while (psVar21->aidx != obj->artifact->aidx);
    textblock_append(tb,"\n");
    textblock_append_c(tb,'\x06',"%s.\n");
    bVar47 = true;
  }
LAB_00199fe8:
  pcVar6 = obj->known->curses;
  if ((pcVar6 != (curse_data *)0x0) && (bVar47 = true, 1 < z_info->curse_max)) {
    uVar33 = 1;
    do {
      if (pcVar6[uVar33].power != L'\0') {
        textblock_append(tb,"It ");
        textblock_append_c(tb,'\f',"%s");
        if (pcVar6[uVar33].power == L'd') {
          textblock_append(tb,"; this curse cannot be removed");
        }
        else {
          textblock_append(tb," (power %d)");
        }
        textblock_append(tb,".\n");
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < z_info->curse_max);
    bVar47 = true;
  }
  peVar7 = obj->known->ego;
  bVar45 = peVar7 != (ego_item *)0x0;
  _Var11 = tval_can_have_flavor_k(obj->kind);
  if (_Var11) {
    _Var11 = object_flavor_is_aware(obj);
    bVar45 = _Var11 || peVar7 != (ego_item *)0x0;
  }
  lVar28 = 0;
  lVar38 = 0;
  bVar2 = 0;
  do {
    bVar46 = obj->known->modifiers[lVar38] != 0;
    if (bVar46) {
      bVar2 = 1;
    }
    lVar28 = lVar28 + (ulong)bVar46;
    lVar38 = lVar38 + 1;
  } while (lVar38 != 0x11);
  if (lVar28 != 0) {
    lVar28 = 0;
    do {
      poVar22 = lookup_obj_property(L'\x02',(wchar_t)lVar28);
      sVar4 = obj->known->modifiers[lVar28];
      if (sVar4 != 0) {
        if ((bool)((mode & 0xcU) == 0U & bVar2)) {
          textblock_append_c(tb,(0 < sVar4) * '\t' + '\x04',"%+i %s.\n");
        }
        else if (bVar45) {
          textblock_append(tb,"Affects your %s\n",poVar22->name);
        }
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0x11);
    bVar47 = true;
  }
  p_Var8 = obj->known->slays;
  if (p_Var8 != (_Bool *)0x0) {
    _Var11 = tval_is_weapon(obj);
    if (_Var11) {
      pcVar37 = "Slays ";
    }
    else {
      _Var11 = tval_is_fuel(obj);
      pcVar37 = "It causes your melee attacks to slay ";
      if (_Var11) {
        pcVar37 = "Slays ";
      }
    }
    iVar31 = 0;
    textblock_append(tb,pcVar37);
    bVar2 = z_info->slay_max;
    if (1 < (ulong)bVar2) {
      iVar31 = 0;
      uVar33 = 1;
      do {
        iVar31 = iVar31 + (uint)p_Var8[uVar33];
        uVar33 = uVar33 + 1;
      } while (bVar2 != uVar33);
    }
    if (iVar31 < 1) {
      __assert_fail("count >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                    ,0x194,"_Bool describe_slays(textblock *, const struct object *)");
    }
    bVar47 = true;
    if (1 < bVar2) {
      uVar33 = 1;
      lVar28 = 0;
      do {
        if (p_Var8[uVar33] == true) {
          textblock_append(tb,"%s",*(undefined8 *)((long)&slays[1].name + lVar28));
          if (0x14 < *(int *)((long)&slays[1].multiplier + lVar28)) {
            textblock_append(tb," (powerfully)");
          }
          pcVar37 = ".\n";
          if (1 < iVar31) {
            pcVar37 = ", ";
          }
          textblock_append(tb,pcVar37);
          iVar31 = iVar31 + -1;
        }
        uVar33 = uVar33 + 1;
        lVar28 = lVar28 + 0x38;
      } while (uVar33 < z_info->slay_max);
      bVar47 = true;
    }
  }
  p_Var8 = obj->known->brands;
  if (p_Var8 != (_Bool *)0x0) {
    _Var11 = tval_is_weapon(obj);
    if (_Var11) {
      pcVar37 = "Branded with ";
    }
    else {
      _Var11 = tval_is_fuel(obj);
      pcVar37 = "It brands your melee attacks with ";
      if (_Var11) {
        pcVar37 = "Branded with ";
      }
    }
    iVar31 = 0;
    textblock_append(tb,pcVar37);
    bVar2 = z_info->brand_max;
    if (1 < (ulong)bVar2) {
      iVar31 = 0;
      uVar33 = 1;
      do {
        iVar31 = iVar31 + (uint)p_Var8[uVar33];
        uVar33 = uVar33 + 1;
      } while (bVar2 != uVar33);
    }
    if (iVar31 < 1) {
      __assert_fail("count >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                    ,0x1ba,"_Bool describe_brands(textblock *, const struct object *)");
    }
    if (bVar2 < 2) {
      bVar47 = true;
    }
    else {
      bVar47 = true;
      uVar33 = 1;
      lVar28 = 0;
      do {
        if (p_Var8[uVar33] == true) {
          if (*(int *)((long)&brands[1].multiplier + lVar28) < 0xf) {
            textblock_append(tb,"weak ");
          }
          textblock_append(tb,"%s",*(undefined8 *)((long)&brands[1].name + lVar28));
          pcVar37 = ".\n";
          if (1 < iVar31) {
            pcVar37 = ", ";
          }
          textblock_append(tb,pcVar37);
          iVar31 = iVar31 + -1;
        }
        uVar33 = uVar33 + 1;
        lVar28 = lVar28 + 0x30;
      } while (uVar33 < z_info->brand_max);
    }
  }
  bVar45 = false;
  uVar33 = 0;
  uVar40 = 0;
  uVar34 = 0;
  lVar28 = 0;
  do {
    sVar4 = (short)local_508.stat_add[lVar28 + -0x1c];
    local_3c8[0].stat_add[lVar28] = (int)sVar4;
    if (sVar4 == 0) {
      uVar40 = uVar40 + 1;
LAB_0019a43e:
      bVar45 = true;
    }
    else {
      if (sVar4 < 100) {
        uVar34 = uVar34 + 1;
        goto LAB_0019a43e;
      }
      if (sVar4 != 100) {
        bVar45 = true;
      }
      uVar33 = uVar33 + (sVar4 != 100);
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x1c);
  if (uVar40 != 0) {
    textblock_append(tb,"Provides immunity to ");
    lVar28 = 2;
    uVar42 = 0;
    do {
      if (local_3c8[0].stat_add[uVar42] == 0) {
        textblock_append(tb,"%s",*(undefined8 *)(&projections->index + lVar28));
        if (1 < uVar40) {
          textblock_append(tb,", ");
        }
        uVar40 = uVar40 - 1;
      }
      if (0x1a < uVar42) break;
      uVar42 = uVar42 + 1;
      lVar28 = lVar28 + 0x1c;
    } while (uVar40 != 0);
    textblock_append(tb,".\n");
  }
  if (uVar34 != 0) {
    textblock_append(tb,"Provides resistance to ");
    lVar28 = 2;
    uVar40 = 0;
    do {
      iVar31 = local_3c8[0].stat_add[uVar40];
      if (iVar31 != 0 && iVar31 < 100) {
        textblock_append(tb,"%s (%d%%)",*(undefined8 *)(&projections->index + lVar28),
                         (ulong)(100 - iVar31));
        if (1 < uVar34) {
          textblock_append(tb,", ");
        }
        uVar34 = uVar34 - 1;
      }
      if (0x1a < uVar40) break;
      uVar40 = uVar40 + 1;
      lVar28 = lVar28 + 0x1c;
    } while (uVar34 != 0);
    textblock_append(tb,".\n");
  }
  if (uVar33 != 0) {
    textblock_append(tb,"Makes you vulnerable to ");
    lVar28 = 2;
    uVar34 = 0;
    do {
      if (100 < local_3c8[0].stat_add[uVar34]) {
        textblock_append(tb,"%s (%d%%)",*(undefined8 *)(&projections->index + lVar28),
                         (ulong)(local_3c8[0].stat_add[uVar34] - 100));
        if (1 < uVar33) {
          textblock_append(tb,", ");
        }
        uVar33 = uVar33 - 1;
      }
      if (0x1a < uVar34) break;
      uVar34 = uVar34 + 1;
      lVar28 = lVar28 + 0x1c;
    } while (uVar33 != 0);
    textblock_append(tb,".\n");
  }
  wVar32 = L'\x01';
  iVar31 = 0;
  do {
    poVar22 = lookup_obj_property(L'\x03',wVar32);
    if ((poVar22->subtype == L'\x02') &&
       (_Var11 = flag_has_dbg(local_5c6,6,poVar22->index,"flags","prop->index"), _Var11)) {
      lVar28 = (long)iVar31;
      iVar31 = iVar31 + 1;
      *(char **)(local_3c8[0].stat_add + lVar28 * 2) = poVar22->desc;
    }
    wVar32 = wVar32 + L'\x01';
  } while (wVar32 != L'-');
  bVar46 = true;
  if (!bVar45) {
    bVar46 = bVar47;
  }
  if (iVar31 != 0) {
    textblock_append(tb,"Provides protection from ");
    info_out_list(tb,(char **)local_3c8,(long)iVar31);
    bVar46 = true;
  }
  lVar28 = 0;
  do {
    *(byte *)((long)local_508.stat_add + lVar28) =
         *(byte *)((long)local_508.stat_add + lVar28 * 4 + -0x6e) >> 1 & 1;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x1c);
  ppcVar23 = &projections->name;
  lVar28 = 0;
  iVar31 = 0;
  do {
    if (*(char *)((long)local_508.stat_add + lVar28) == '\x01') {
      lVar38 = (long)iVar31;
      iVar31 = iVar31 + 1;
      *(char **)(local_3c8[0].stat_add + lVar38 * 2) = *ppcVar23;
    }
    lVar28 = lVar28 + 1;
    ppcVar23 = ppcVar23 + 0xe;
  } while (lVar28 != 0x1c);
  if (iVar31 != 0) {
    textblock_append(tb,"Cannot be harmed by ");
    info_out_list(tb,(char **)local_3c8,(long)iVar31);
    bVar46 = true;
  }
  lVar28 = 0;
  do {
    *(byte *)((long)local_508.stat_add + lVar28) =
         *(byte *)((long)local_508.stat_add + lVar28 * 4 + -0x6e) & 1;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x1c);
  ppcVar23 = &projections->name;
  lVar28 = 0;
  iVar31 = 0;
  do {
    if (*(char *)((long)local_508.stat_add + lVar28) == '\x01') {
      lVar38 = (long)iVar31;
      iVar31 = iVar31 + 1;
      *(char **)(local_3c8[0].stat_add + lVar38 * 2) = *ppcVar23;
    }
    lVar28 = lVar28 + 1;
    ppcVar23 = ppcVar23 + 0xe;
  } while (lVar28 != 0x1c);
  if (iVar31 != 0) {
    textblock_append(tb,"Can be destroyed by ");
    info_out_list(tb,(char **)local_3c8,(long)iVar31);
    bVar46 = true;
  }
  iVar31 = 0;
  wVar32 = L'\0';
  do {
    poVar22 = lookup_obj_property(L'\x01',wVar32);
    wVar15 = sustain_flag(poVar22->index);
    _Var11 = flag_has_dbg(local_5c6,6,wVar15,"flags","sustain_flag(prop->index)");
    if (_Var11) {
      lVar28 = (long)iVar31;
      iVar31 = iVar31 + 1;
      *(char **)(local_3c8[0].stat_add + lVar28 * 2) = poVar22->name;
    }
    wVar32 = wVar32 + L'\x01';
  } while (wVar32 != L'\x05');
  if (iVar31 != 0) {
    textblock_append(tb,"Sustains ");
    info_out_list(tb,(char **)local_3c8,(long)iVar31);
    bVar46 = true;
  }
  wVar32 = L'\x01';
  bVar47 = false;
  do {
    poVar22 = lookup_obj_property(L'\x03',wVar32);
    if ((((uint)poVar22->subtype < 7) && ((0x68U >> (poVar22->subtype & 0x1fU) & 1) != 0)) &&
       (_Var11 = flag_has_dbg(local_5c6,6,poVar22->index,"flags","prop->index"), _Var11)) {
      textblock_append(tb,"%s.  ",poVar22->desc);
      bVar47 = true;
    }
    wVar32 = wVar32 + L'\x01';
  } while (wVar32 != L'-');
  if (bVar47) {
    textblock_append(tb,"\n");
    bVar46 = true;
  }
  _Var11 = tval_is_light(obj);
  if ((_Var11) || (0 < obj->modifiers[0xd])) {
    _Var12 = flag_has_dbg(obj->flags,6,0x22,"obj->flags","OF_LIGHT_2");
    iVar31 = 2;
    if (!_Var12) {
      _Var12 = flag_has_dbg(obj->flags,6,0x23,"obj->flags","OF_LIGHT_3");
      iVar31 = (uint)_Var12 + (uint)_Var12 * 2;
    }
    if (obj->known->modifiers[0xd] + iVar31 == 0) goto LAB_0019aa22;
    _Var12 = flag_has_dbg(obj->known->flags,6,0x19,"obj->known->flags","OF_NO_FUEL");
    uVar44 = 0;
    bVar47 = false;
    if (!_Var12) {
      bVar47 = obj->known->artifact == (artifact *)0x0;
    }
    bVar45 = true;
    bVar10 = true;
    if (!_Var11) goto LAB_0019aa29;
    _Var11 = flag_has_dbg(obj->known->flags,6,0x18,"obj->known->flags","OF_TAKES_FUEL");
    if (_Var11) {
      uVar44 = (uint)z_info->fuel_lamp;
    }
  }
  else {
LAB_0019aa22:
    bVar47 = false;
    bVar10 = false;
LAB_0019aa29:
    bVar45 = bVar10;
    uVar44 = 0;
  }
  if (bVar45) {
    _Var11 = tval_is_light(obj);
    bVar46 = true;
    if (_Var11) {
      textblock_append(tb,"Intensity ");
      textblock_append_c(tb,'\r',"%d");
      textblock_append(tb," light.");
      if ((obj->artifact == (artifact *)0x0) && (!bVar47)) {
        textblock_append(tb,"  No fuel required.");
      }
      if ((mode & 1U) == 0) {
        if (uVar44 == 0) {
          textblock_append(tb,"  Cannot be refueled.");
        }
        else {
          textblock_append(tb,"  Refills other lanterns up to %d turns of fuel.",(ulong)uVar44);
        }
      }
      textblock_append(tb,"\n");
    }
  }
  _Var11 = obj_can_browse(obj);
  if (_Var11) {
    textblock_append(tb,"\nYou can read this book.\n");
    bVar46 = true;
  }
  bVar47 = bVar46;
  if ((mode & 4U) != 0) {
    peVar7 = obj->ego;
    flags_00 = peVar7->kind_flags;
    _Var11 = flag_has_dbg(flags_00,4,5,"ego->kind_flags","KF_RAND_HI_RES");
    if (_Var11) {
      pcVar37 = "It provides one random higher resistance.  ";
LAB_0019ac26:
      textblock_append(tb,pcVar37);
      bVar45 = true;
    }
    else {
      _Var11 = flag_has_dbg(flags_00,4,6,"ego->kind_flags","KF_RAND_SUSTAIN");
      if (_Var11) {
        pcVar37 = "It provides one random sustain.  ";
        goto LAB_0019ac26;
      }
      _Var11 = flag_has_dbg(flags_00,4,7,"ego->kind_flags","KF_RAND_POWER");
      if (_Var11) {
        pcVar37 = "It provides one random ability.  ";
        goto LAB_0019ac26;
      }
      _Var11 = flag_has_dbg(flags_00,4,3,"ego->kind_flags","KF_RAND_RES");
      if (_Var11) {
        pcVar37 = "It provides one random resistance.  ";
        goto LAB_0019ac26;
      }
      bVar45 = false;
    }
    _Var11 = flag_has_dbg(peVar7->flags,6,0x19,"ego->flags","OF_NO_FUEL");
    if ((_Var11) &&
       (_Var11 = flag_has_dbg(peVar7->flags_off,6,0x18,"ego->flags_off","OF_TAKES_FUEL"), _Var11)) {
      textblock_append(tb,"It burns forever without fuel.  ");
      bVar45 = true;
    }
    bVar47 = true;
    if (!bVar45) {
      bVar47 = bVar46;
    }
  }
  if (bVar47) {
    textblock_append(tb,"\n");
  }
  if ((mode & 4U) == 0) {
    if (((mode & 1U) == 0) || (obj->artifact != (artifact *)0x0)) {
      _Var11 = object_is_in_store(obj);
      if (_Var11) {
        _Var11 = tval_is_useable(obj);
      }
      else {
        _Var11 = false;
      }
      _Var12 = object_effect_is_known(obj);
      effect = object_effect(obj);
      if (_Var12 || _Var11 != false) {
        prVar1 = &obj->time;
        v_01 = *prVar1;
        v_00 = *prVar1;
        v = *prVar1;
        _Var11 = effect_aim(effect);
        iVar16 = randcalc(v,0,MAXIMISE);
        iVar31 = 0;
        iVar17 = 0;
        if (0 < iVar16) {
          iVar31 = randcalc(v_00,0,MINIMISE);
          iVar17 = randcalc(v_01,0,MAXIMISE);
        }
        _Var12 = tval_is_edible(obj);
        bVar45 = true;
        if (((_Var12) || (_Var12 = tval_is_potion(obj), _Var12)) ||
           (_Var12 = tval_is_scroll(obj), _Var12)) {
LAB_0019ae36:
          bVar45 = true;
          wVar32 = L'\0';
        }
        else {
          wVar32 = get_use_device_chance(obj);
        }
      }
      else if (effect == (effect *)0x0) {
        effect = (effect *)0x0;
        _Var11 = false;
        iVar31 = 0;
        iVar17 = 0;
        wVar32 = L'\0';
        bVar45 = false;
      }
      else {
        _Var11 = tval_is_wand(obj);
        if ((!_Var11) && (_Var11 = tval_is_rod(obj), !_Var11)) {
          effect = (effect *)0x0;
          _Var11 = false;
          iVar31 = 0;
          iVar17 = 0;
          goto LAB_0019ae36;
        }
        effect = (effect *)0x0;
        _Var11 = true;
        iVar31 = 0;
        iVar17 = 0;
        wVar32 = L'\0';
        bVar45 = true;
      }
      if (bVar45) {
        if ((effect == (effect *)0x0) && (peVar24 = object_effect(obj), peVar24 != (effect *)0x0)) {
          _Var12 = tval_is_edible(obj);
          if (_Var12) {
            pcVar37 = "It can be eaten.\n";
          }
          else {
            _Var12 = tval_is_potion(obj);
            if (_Var12) {
              pcVar37 = "It can be drunk.\n";
            }
            else {
              _Var12 = tval_is_scroll(obj);
              if (_Var12) {
                pcVar37 = "It can be read.\n";
              }
              else if (_Var11 == false) {
                pcVar37 = "It can be activated.\n";
              }
              else {
                pcVar37 = "It can be aimed.\n";
              }
            }
          }
          textblock_append(tb,pcVar37);
        }
        else {
          if ((obj->activation == (activation *)0x0) || (obj->activation->desc == (char *)0x0)) {
            if (obj->artifact == (artifact *)0x0) {
              pwVar25 = &obj->kind->level;
            }
            else {
              pwVar25 = &obj->artifact->level;
            }
            iVar39 = (player->state).skills[2] - *pwVar25;
            iVar16 = 0;
            if (-2 < iVar39) {
              iVar16 = iVar39 / 2;
            }
            if (_Var11 == false) {
              _Var11 = tval_is_edible(obj);
              if (_Var11) {
                pcVar37 = "When eaten, it ";
              }
              else {
                _Var11 = tval_is_potion(obj);
                if (_Var11) {
                  pcVar37 = "When quaffed, it ";
                }
                else {
                  _Var11 = tval_is_scroll(obj);
                  pcVar37 = "When activated, it ";
                  if (_Var11) {
                    pcVar37 = "When read, it ";
                  }
                }
              }
            }
            else {
              pcVar37 = "When aimed, it ";
            }
            tba = effect_describe(effect,pcVar37,iVar16,false);
            if (tba == (textblock *)0x0) goto LAB_0019b176;
            textblock_append_textblock(tb,tba);
            textblock_free(tba);
          }
          else {
            textblock_append(tb,"When activated, it ");
            textblock_append(tb,"%s",obj->activation->desc);
          }
          textblock_append(tb,".\n");
          if (iVar31 != 0 || iVar17 != 0) {
            wVar18 = turn_energy((player->state).speed);
            wVar15 = L'\n';
            if ((mode & 2U) != 0) {
              wVar15 = wVar18;
            }
            textblock_append(tb,"Takes ");
            textblock_append_c(tb,'\r',"%d");
            if ((iVar31 * wVar15) / 10 != (wVar15 * iVar17) / 10) {
              textblock_append(tb," to ");
              textblock_append_c(tb,'\r',"%d");
            }
            textblock_append(tb," turns to recharge");
            if (((mode & 2U) != 0) && ((player->state).speed != L'n')) {
              textblock_append(tb," at your current speed");
            }
            textblock_append(tb,".\n");
          }
          if (L'\0' < wVar32) {
            textblock_append(tb,"Your chance of success is %d.%d%%\n");
          }
        }
        textblock_append(tb,"\n");
        bVar47 = true;
      }
    }
LAB_0019b176:
    if ((mode & 2U) != 0) {
      poVar27 = equipped_item_by_slot_name(player,"shooting");
      _Var11 = tval_is_melee_weapon(obj);
      bVar45 = (player->state).ammo_tval == (uint)obj->tval;
      if (_Var11) {
        _Var12 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
        local_5bc = (uint)CONCAT71(extraout_var,_Var12);
      }
      else {
        local_5bc = 0;
      }
      _Var12 = tval_is_ammo(obj);
      if (_Var12) {
        _Var12 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
      }
      else {
        _Var12 = false;
      }
      poVar26 = equipped_item_by_slot_name(player,"shooting");
      _Var13 = tval_is_melee_weapon(obj);
      bVar46 = (player->state).ammo_tval != (uint)obj->tval;
      local_5b4 = 0;
      if (_Var13) {
LAB_0019b2b1:
        _Var14 = false;
      }
      else {
        _Var14 = false;
        if (poVar26 == (object *)0x0 || bVar46) {
          _Var14 = tval_is_potion(obj);
          if (((!_Var14) || (obj->dd == '\0')) || (obj->ds == '\0')) goto LAB_0019b2b1;
          _Var14 = object_flavor_is_aware(obj);
        }
      }
      if (poVar26 != (object *)0x0 && !bVar46) {
        uVar44 = (player->state).ammo_mult * 2 + 0xc;
        uVar36 = (uint)z_info->max_range;
        if ((int)uVar44 < (int)(uint)z_info->max_range) {
          uVar36 = uVar44;
        }
        local_5b4 = uVar36 * 5;
      }
      bVar46 = bVar45 && poVar27 != (object *)0x0;
      local_59c = breakage_chance(obj,true);
      cVar43 = '\0';
      if (_Var13) {
        wVar32 = slot_by_name(player,"weapon");
        local_5b0 = equipped_item_by_slot_name(player,"weapon");
        (player->body).slots[wVar32].obj = obj;
        ppVar9 = player;
        memcpy(local_3c8,&player->state,0x13c);
        local_3c8[0].stat_ind[0] = 0;
        local_3c8[0].stat_ind[3] = 0;
        calc_bonuses(ppVar9,local_3c8,true,false);
        (player->body).slots[wVar32].obj = local_5b0;
        cVar43 = local_3c8[0].heavy_wield;
      }
      if ((_Var11 || bVar45 && poVar27 != (object *)0x0) || _Var12 != false) {
        uVar44 = 0;
        textblock_append_c(tb,'\t',"Combat info:\n");
        if (cVar43 != '\0') {
          textblock_append_c(tb,'\f',"You are too weak to use this weapon.\n");
        }
        wVar32 = slot_by_name(player,"weapon");
        poVar27 = slot_object(player,wVar32);
        _Var13 = tval_is_melee_weapon(obj);
        if (_Var13) {
          (player->body).slots[wVar32].obj = obj;
          ppVar9 = player;
          memcpy(&local_508,&player->state,0x13c);
          iVar31 = 0;
          local_508.stat_ind[0] = 0;
          local_508.stat_ind[3] = 0;
          uVar44 = 1;
          calc_bonuses(ppVar9,&local_508,true,false);
          local_3c8[0].stat_add[0] = 0;
          local_3c8[0].stat_add[1] = 0;
          local_5b8 = local_508.num_blows;
          local_3c8[0].stat_add[2] = local_508.num_blows;
          if (local_508.stat_ind[3] < 0x26) {
            local_5a0 = local_508.stat_ind[0];
            iVar17 = 0x26 - local_508.stat_ind[0];
            local_5b0 = (object *)CONCAT44(local_5b0._4_4_,(local_508.num_blows / 10) * 10);
            uVar44 = 1;
            if (iVar17 < 2) {
              iVar17 = 1;
            }
            local_5a4 = 0x26 - local_508.stat_ind[3];
            if (0x26 - local_508.stat_ind[3] < 2) {
              local_5a4 = 1;
            }
            iVar16 = -1;
            local_5c0 = -1;
            do {
              if (local_5a0 < 0x26) {
                iVar39 = 0;
                do {
                  if (uVar44 == 0x4c) {
                    (player->body).slots[wVar32].obj = poVar27;
                    iVar19 = 1;
                    uVar44 = 0x4c;
                  }
                  else {
                    local_508.stat_ind[0] = iVar39;
                    local_508.stat_ind[3] = iVar31;
                    calc_bonuses(player,&local_508,true,false);
                    iVar19 = (local_508.num_blows / 10) * 10;
                    if (((int)local_5b0 < iVar19) && (iVar16 == -1 || iVar39 < iVar16)) {
                      lVar28 = (long)(int)uVar44;
                      local_3c8[0].stat_add[lVar28 * 3] = iVar39;
                      local_3c8[0].stat_add[lVar28 * 3 + 1] = iVar31;
                      local_3c8[0].stat_add[lVar28 * 3 + 2] = iVar19;
                      uVar44 = uVar44 + 1;
                      iVar19 = 5;
                      iVar16 = iVar39;
                    }
                    else {
                      iVar19 = 0;
                      if ((local_5b8 < local_508.num_blows) &&
                         ((local_5c0 == -1 || iVar39 < local_5c0 &&
                          (iVar16 == -1 || iVar39 < iVar16)))) {
                        lVar28 = (long)(int)uVar44;
                        local_3c8[0].stat_add[lVar28 * 3] = iVar39;
                        local_3c8[0].stat_add[lVar28 * 3 + 1] = iVar31;
                        local_3c8[0].stat_add[lVar28 * 3 + 2] = local_508.num_blows;
                        uVar44 = uVar44 + 1;
                        local_5c0 = iVar39;
                      }
                    }
                  }
                  if (iVar19 != 0) {
                    if (iVar19 != 5) {
                      uVar44 = 0x4c;
                      goto LAB_0019b6c7;
                    }
                    break;
                  }
                  iVar39 = iVar39 + 1;
                } while (iVar17 != iVar39);
              }
              iVar31 = iVar31 + 1;
            } while (iVar31 != local_5a4);
          }
          (player->body).slots[wVar32].obj = poVar27;
        }
LAB_0019b6c7:
        iVar31 = local_3c8[0].stat_add[2];
        if (uVar44 != 0) {
          textblock_append_c(tb,'\r',"%d.%d ",(ulong)(uint)(local_3c8[0].stat_add[2] / 100),
                             (ulong)(uint)((local_3c8[0].stat_add[2] / 10) % 10));
          pcVar37 = "";
          if (L'd' < iVar31) {
            pcVar37 = "s";
          }
          textblock_append(tb,"blow%s/round.\n",pcVar37);
          if (1 < (int)uVar44) {
            lVar28 = 0;
            do {
              uVar33 = (ulong)*(uint *)((long)local_3c8[0].stat_add + lVar28 + 0xc);
              iVar31 = *(int *)((long)local_3c8[0].stat_ind + lVar28);
              uVar36 = iVar31 * -0x33333333 + 0x19999998;
              if ((uVar36 >> 1 | (uint)((uVar36 & 1) != 0) << 0x1f) < 0x19999999) {
                textblock_append(tb,"With +%d STR and +%d DEX you would get %d.%d blows\n",uVar33,
                                 (ulong)*(uint *)((long)local_3c8[0].stat_add + lVar28 + 0x10),
                                 (ulong)(uint)(iVar31 / 100),(ulong)(uint)((iVar31 / 10) % 10));
              }
              else {
                textblock_append(tb,"With +%d STR and +%d DEX you would attack a bit faster\n",
                                 uVar33);
              }
              lVar28 = lVar28 + 0xc;
            } while ((ulong)uVar44 * 0xc + -0xc != lVar28);
          }
        }
        if (bVar46) {
          textblock_append(tb,"When fired, hits targets up to ");
          textblock_append_c(tb,'\r',"%d");
          textblock_append(tb," feet away.\n");
        }
        if (_Var11 || bVar46) {
          describe_damage(tb,obj,false);
        }
        if ((local_5bc & 1) != 0 || _Var12 != false) {
          describe_damage(tb,obj,true);
        }
        if (bVar46) {
          textblock_append_c(tb,'\r',"%d%%");
          pcVar37 = " chance of breaking upon contact.\n";
LAB_0019b8c9:
          textblock_append(tb,pcVar37);
        }
        textblock_append(tb,"\n");
        bVar47 = true;
      }
      else if (_Var14 != false) {
        pcVar37 = "It can be thrown at creatures with damaging effect.\n";
        goto LAB_0019b8c9;
      }
    }
    if (((((mode & 3U) == 2) && (_Var11 = tval_is_wearable(obj), _Var11)) &&
        ((_Var11 = tval_is_melee_weapon(obj), _Var11 || (0 < obj->modifiers[8])))) &&
       ((_Var11 = tval_is_melee_weapon(obj), _Var11 || (obj->known->modifiers[8] != 0)))) {
      wVar32 = wield_slot(obj);
      poVar27 = slot_object(player,wVar32);
      (player->body).slots[wVar32].obj = obj;
      ppVar9 = player;
      memcpy(local_3c8,&player->state,0x13c);
      lVar28 = 0;
      local_3c8[0].stat_ind[0] = 0;
      local_3c8[0].stat_ind[3] = 0;
      calc_bonuses(ppVar9,local_3c8,true,false);
      (player->body).slots[wVar32].obj = poVar27;
      calc_digging_chances(local_3c8,local_508.stat_add);
      do {
        iVar31 = local_508.stat_add[lVar28];
        iVar17 = 0;
        if (iVar31 != 0) {
          if (0x63f < iVar31) {
            iVar31 = 0x640;
          }
          iVar17 = (int)(16000 / (long)iVar31);
        }
        local_598[lVar28] = iVar17;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 5);
      puVar30 = &describe_digger_names;
      lVar28 = 0;
      do {
        if ((lVar28 == 0) && (0 < local_598[0])) {
          _Var11 = tval_is_melee_weapon(obj);
          pcVar37 = "With this item, your current weapon clears ";
          if (_Var11) {
            pcVar37 = "Clears ";
          }
          textblock_append(tb,pcVar37);
        }
        if ((lVar28 == 0xc) || ((lVar28 != 0 && (*(int *)((long)local_598 + lVar28) == 0)))) {
          textblock_append(tb,"and ");
        }
        iVar31 = *(int *)((long)local_598 + lVar28);
        if (iVar31 == 0) {
          textblock_append_c(tb,'\f',"doesn\'t affect ");
          textblock_append(tb,"%s.\n",*puVar30);
          break;
        }
        textblock_append(tb,"%s in ",*puVar30);
        if (iVar31 == 10) {
          textblock_append_c(tb,'\r',"1 ");
          pcVar37 = "";
        }
        else {
          if (iVar31 < 100) {
            textblock_append_c(tb,'\x05',"%d.%d ",(ulong)(uint)(iVar31 / 10),
                               (ulong)(uint)(iVar31 % 10));
          }
          else {
            attr = '\x04';
            if (iVar31 < 1000) {
              attr = '\v';
            }
            textblock_append_c(tb,attr,"%d ",(ulong)(iVar31 + 5) / 10);
          }
          pcVar37 = "s";
        }
        pcVar41 = ", ";
        if (lVar28 == 0xc) {
          pcVar41 = ".\n";
        }
        textblock_append(tb,"turn%s%s",pcVar37,pcVar41);
        puVar30 = puVar30 + 1;
        lVar28 = lVar28 + 4;
      } while (lVar28 != 0x10);
      bVar47 = true;
    }
  }
  if ((mode & 1U) == 0) {
    if (bVar47) {
      textblock_append(tb,"\n%s\n",kb_info[obj->tval].text);
    }
    else {
      pcVar37 = "\n\nThis item does not seem to possess any special abilities.";
LAB_00199ba4:
      textblock_append(tb,pcVar37);
    }
  }
  return tb;
}

Assistant:

static textblock *object_info_out(const struct object *obj, int mode)
{
	bitflag flags[OF_SIZE];
	struct element_info el_info[ELEM_MAX];
	bool something = false;

	bool terse = mode & OINFO_TERSE ? true : false;
	bool subjective = mode & OINFO_SUBJ ? true : false;
	bool ego = mode & OINFO_EGO ? true : false;
	textblock *tb = textblock_new();

	assert(obj->known);

	/* Unaware objects get simple descriptions */
	if (obj->kind != obj->known->kind) {
		textblock_append(tb, "\n\nYou do not know what this is.\n");
		return tb;
	}

	/* Grab the object flags */
	get_known_flags(obj, mode, flags);

	/* Grab the element info */
	get_known_elements(obj, mode, el_info);

	if (subjective) describe_origin(tb, obj, terse);
	if (!terse) describe_flavor_text(tb, obj, ego);

	if (!object_fully_known(obj) &&	(obj->known->notice & OBJ_NOTICE_ASSESSED) && !tval_is_useable(obj)) {
		textblock_append(tb, "You do not know the full extent of this item's powers.\n");
		something = true;
	}

	if (describe_set(tb, obj)) something = true;
	if (describe_curses(tb, obj, flags)) something = true;
	if (describe_stats(tb, obj, mode)) something = true;
	if (describe_slays(tb, obj)) something = true;
	if (describe_brands(tb, obj)) something = true;
	if (describe_elements(tb, el_info)) something = true;
	if (describe_protects(tb, flags)) something = true;
	if (describe_ignores(tb, el_info)) something = true;
	if (describe_hates(tb, el_info)) something = true;
	if (describe_sustains(tb, flags)) something = true;
	if (describe_misc_magic(tb, flags)) something = true;
	if (describe_light(tb, obj, mode)) something = true;
	if (describe_book(tb, obj, mode)) something = true;
	if (ego && describe_ego(tb, obj->ego)) something = true;
	if (something) textblock_append(tb, "\n");

	/* Skip all the very specific information where we are giving general
	   ego knowledge rather than for a single item - abilities can vary */
	if (!ego) {
		if (describe_effect(tb, obj, terse, subjective)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (subjective && describe_combat(tb, obj)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (!terse && subjective && describe_digger(tb, obj)) something = true;
	}

	/* Don't append anything in terse (for chararacter dump) */
	if (!terse) {
		if (!something) {
			textblock_append(tb, "\n\nThis item does not seem to possess any special abilities.");
		} else {
			textblock_append(tb, "\n%s\n", kb_info[obj->tval].text);
		}
	}

	return tb;
}